

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckerTester.cpp
# Opt level: O2

void __thiscall psy::C::TypeCheckerTester::case0732(TypeCheckerTester *this)

{
  Expectation *pEVar1;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  Expectation local_178;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,
             "\nstruct s {\n    struct {\n        struct {\n            const int m ;\n        } ;\n    } ;\n} ;\nvoid _ ()\n{\n    struct s x = { { { 42 } } };\n    struct s y ;\n    y = x ;\n}\n"
             ,&local_1b9);
  Expectation::Expectation(&local_178);
  std::__cxx11::string::string
            ((string *)&local_1b8,
             (string *)
             &TypeChecker::DiagnosticsReporter::
              ID_of_CannotAssignToExpressionOfConstQualifiedType_abi_cxx11_);
  pEVar1 = Expectation::diagnostic(&local_178,Error,&local_1b8);
  Expectation::Expectation(&local_c0,pEVar1);
  checkTypes(this,&local_198,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::__cxx11::string::~string((string *)&local_1b8);
  Expectation::~Expectation(&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  return;
}

Assistant:

void TypeCheckerTester::case0732()
{
    auto s = R"(
struct s {
    struct {
        struct {
            const int m ;
        } ;
    } ;
} ;
void _ ()
{
    struct s x = { { { 42 } } };
    struct s y ;
    y = x ;
}
)";

    checkTypes(
        s,
        Expectation()
            .diagnostic(
                Expectation::ErrorOrWarn::Error,
                TypeChecker::DiagnosticsReporter::ID_of_CannotAssignToExpressionOfConstQualifiedType));
}